

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

int ON_InsertKnot(double knot_value,int knot_multiplicity,int cv_dim,int order,int cv_count,
                 int cv_stride,double *cv,double *knot,int *hint)

{
  double *knot_00;
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  double *pdVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  void *pvVar15;
  double *__dest;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  void *pvVar22;
  void *__dest_00;
  int iVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  void *local_e8;
  uint local_e0;
  size_t local_c8;
  int local_bc;
  ulong uVar21;
  
  if ((order < 2) || (uVar19 = (ulong)(uint)order, cv_count < order || knot == (double *)0x0)) {
    pcVar11 = "ON_InsertKnot(): illegal input";
    iVar3 = 0x521;
  }
  else if ((cv == (double *)0x0) || (0 < cv_dim && cv_dim <= cv_stride)) {
    if (knot_multiplicity < order) {
      if (hint == (int *)0x0) {
        iVar3 = 0;
      }
      else {
        iVar3 = *hint;
      }
      iVar4 = cv_count;
      iVar3 = ON_NurbsSpanIndex(order,cv_count,knot,knot_value,1,iVar3);
      knot_00 = knot + iVar3;
      __dest = cv + iVar3 * cv_stride;
      if (cv == (double *)0x0) {
        __dest = (double *)0x0;
      }
      dVar25 = ON_SpanTolerance(order,iVar4,knot_00,0);
      if (((iVar3 != 0) || (knot_00[uVar19 - 1] <= knot_value)) ||
         (knot_00[uVar19 - 2] + dVar25 < knot_value)) {
        iVar4 = cv_count - iVar3;
        if (((iVar3 != iVar4 - order) ||
            (knot_value < knot_00[uVar19 - 2] || knot_value == knot_00[uVar19 - 2])) ||
           (knot_value < knot_00[uVar19 - 1] - dVar25)) {
          dVar1 = knot_00[order - 2];
          uVar20 = order - 1;
          uVar21 = (ulong)uVar20;
          dVar2 = knot_00[uVar21];
          if ((((dVar1 + dVar2) * 0.5 < knot_value) ||
              (dVar26 = dVar1, dVar25 < ABS(knot_value - dVar1))) &&
             (dVar26 = knot_value, ABS(knot_value - dVar2) <= dVar25)) {
            dVar26 = dVar2;
          }
          if ((dVar26 != dVar1) || (NAN(dVar26) || NAN(dVar1))) {
            if ((dVar26 != dVar2) || (NAN(dVar26) || NAN(dVar2))) {
              uVar6 = 0;
            }
            else {
              uVar13 = 0;
              uVar6 = 0;
              if (0 < knot_multiplicity) {
                uVar6 = (ulong)(uint)knot_multiplicity;
              }
              for (; uVar6 != uVar13; uVar13 = uVar13 + 1) {
                if ((knot_00[uVar21 + uVar13] != dVar26) ||
                   (NAN(knot_00[uVar21 + uVar13]) || NAN(dVar26))) {
                  uVar6 = uVar13 & 0xffffffff;
                  break;
                }
              }
            }
          }
          else {
            lVar12 = 0;
            uVar6 = 0;
            if (0 < knot_multiplicity) {
              uVar6 = (ulong)(uint)knot_multiplicity;
            }
            for (; -lVar12 != uVar6; lVar12 = lVar12 + -1) {
              if ((knot[(long)iVar3 + (ulong)(order - 2) + lVar12] != dVar26) ||
                 (NAN(knot[(long)iVar3 + (ulong)(order - 2) + lVar12]) || NAN(dVar26))) {
                uVar6 = (ulong)(uint)-(int)lVar12;
                break;
              }
            }
          }
          iVar23 = knot_multiplicity - (int)uVar6;
          if (hint != (int *)0x0) {
            *hint = iVar23 + iVar3;
          }
          if (iVar23 < 1) {
            return 0;
          }
          uVar10 = iVar23 + uVar20 * 2;
          pvVar7 = onmalloc((long)(int)((iVar23 + order) * cv_dim + uVar10) << 3);
          if (pvVar7 != (void *)0x0) {
            memcpy(pvVar7,knot_00,(ulong)(uVar20 * 2) * 8);
            lVar12 = (long)cv_stride;
            if (__dest == (double *)0x0) {
              local_c8 = (long)cv_dim * 8;
              local_e8 = (void *)0x0;
            }
            else {
              local_e8 = (void *)((long)pvVar7 + (ulong)uVar10 * 8);
              local_c8 = (long)cv_dim * 8;
              uVar6 = uVar19;
              pvVar22 = local_e8;
              pdVar9 = __dest;
              while (bVar24 = uVar6 != 0, uVar6 = uVar6 - 1, bVar24) {
                memcpy(pvVar22,pdVar9,local_c8);
                pvVar22 = (void *)((long)pvVar22 + local_c8);
                pdVar9 = pdVar9 + lVar12;
              }
            }
            iVar17 = ((cv_count + order) - iVar3) + -3;
            pvVar22 = (void *)((ulong)(uVar20 * 2) * 8 + (long)pvVar7);
            iVar5 = 0;
            local_e0 = 0;
            local_bc = order;
            do {
              if (iVar23 < 1) {
LAB_004d96a3:
                pvVar7 = (void *)((long)pvVar7 + (ulong)local_e0 * -8);
                if (local_e0 != 0) {
                  iVar23 = (iVar3 + order) - cv_count;
                  for (lVar8 = 0; iVar23 != (int)lVar8; lVar8 = lVar8 + -1) {
                    knot_00[iVar17 + lVar8] = knot[(long)iVar3 + (order + iVar4 + -3) + lVar8];
                  }
                  memcpy(knot_00 + uVar21,(void *)((long)pvVar7 + uVar21 * 8),
                         (ulong)(uVar20 + local_e0) << 3);
                  if (__dest != (double *)0x0) {
                    iVar3 = (iVar4 + -1) * cv_stride;
                    for (; iVar23 != 0; iVar23 = iVar23 + 1) {
                      memcpy(__dest + (iVar5 + iVar3),__dest + iVar3,local_c8);
                      iVar3 = iVar3 - cv_stride;
                    }
                    local_e8 = (void *)((long)local_e8 + (long)iVar5 * -8);
                    while (bVar24 = local_bc != 0, local_bc = local_bc + -1, bVar24) {
                      memcpy(__dest,local_e8,local_c8);
                      __dest = __dest + lVar12;
                      local_e8 = (void *)((long)local_e8 + (long)cv_dim * 8);
                    }
                  }
                }
                onfree(pvVar7);
                return local_e0;
              }
              if ((dVar26 < *(double *)((long)pvVar7 + uVar19 * 8 + -0x10)) ||
                 (*(double *)((long)pvVar7 + uVar21 * 8) <= dVar26)) {
                pcVar11 = "ON_InsertSingleKnot() - illegal knot input";
                iVar23 = 0x4cb;
LAB_004d968c:
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                           ,iVar23,"",pcVar11);
                goto LAB_004d96a3;
              }
              if ((cv_dim < 1) && (local_e8 != (void *)0x0)) {
                pcVar11 = "ON_InsertSingleKnot() - illegal cv input";
                iVar23 = 0x4d1;
                goto LAB_004d968c;
              }
              for (lVar8 = 0; 1 - order != (int)lVar8; lVar8 = lVar8 + -1) {
                *(undefined8 *)((long)pvVar22 + lVar8 * 8) =
                     *(undefined8 *)((long)pvVar22 + lVar8 * 8 + -8);
              }
              *(double *)((long)pvVar22 + lVar8 * 8) = dVar26;
              if (local_e8 != (void *)0x0) {
                __dest_00 = (void *)((long)local_e8 + (long)(order * cv_dim) * 8);
                memcpy(__dest_00,(void *)((long)local_e8 + (long)(int)(uVar20 * cv_dim) * 8),
                       local_c8);
                pdVar9 = (double *)((long)pvVar7 + uVar21 * 8 + -8);
                pdVar14 = (double *)((long)pvVar7 + uVar19 * 8 + uVar21 * 8 + -8);
                pvVar15 = (void *)((long)__dest_00 + (long)cv_dim * -8);
                uVar6 = uVar21;
                if (dVar26 - *(double *)((long)pvVar7 + uVar21 * 8 + -8) <= *pdVar14 - dVar26) {
                  while (iVar16 = (int)uVar6, uVar6 = (ulong)(iVar16 - 1), iVar16 != 0) {
                    dVar25 = (dVar26 - *pdVar9) / (*pdVar14 - *pdVar9);
                    lVar8 = 0;
                    for (lVar18 = 0; -cv_dim != (int)lVar18; lVar18 = lVar18 + -1) {
                      *(double *)((long)__dest_00 + lVar18 * 8 + -8) =
                           *(double *)((long)__dest_00 + lVar18 * 8 + -8) * dVar25 +
                           *(double *)((long)pvVar15 + lVar18 * 8 + -8) * (1.0 - dVar25);
                      lVar8 = lVar8 + 8;
                    }
                    pdVar9 = pdVar9 + -1;
                    pdVar14 = pdVar14 + -1;
                    pvVar15 = (void *)((long)pvVar15 - lVar8);
                    __dest_00 = (void *)((long)__dest_00 - lVar8);
                  }
                }
                else {
                  while (iVar16 = (int)uVar6, uVar6 = (ulong)(iVar16 - 1), iVar16 != 0) {
                    dVar25 = (*pdVar14 - dVar26) / (*pdVar14 - *pdVar9);
                    lVar8 = 0;
                    for (lVar18 = 0; -cv_dim != (int)lVar18; lVar18 = lVar18 + -1) {
                      *(double *)((long)__dest_00 + lVar18 * 8 + -8) =
                           *(double *)((long)__dest_00 + lVar18 * 8 + -8) * (1.0 - dVar25) +
                           *(double *)((long)pvVar15 + lVar18 * 8 + -8) * dVar25;
                      lVar8 = lVar8 + 8;
                    }
                    pdVar9 = pdVar9 + -1;
                    pdVar14 = pdVar14 + -1;
                    pvVar15 = (void *)((long)pvVar15 - lVar8);
                    __dest_00 = (void *)((long)__dest_00 - lVar8);
                  }
                }
              }
              iVar23 = iVar23 + -1;
              if (local_e8 != (void *)0x0) {
                local_e8 = (void *)((long)local_e8 + lVar12 * 8);
              }
              pvVar7 = (void *)((long)pvVar7 + 8);
              local_e0 = local_e0 + 1;
              iVar5 = iVar5 + cv_stride;
              local_bc = local_bc + 1;
              iVar17 = iVar17 + 1;
              pvVar22 = (void *)((long)pvVar22 + 8);
            } while( true );
          }
          pcVar11 = "ON_InsertKnot(): out of memory";
          iVar3 = 0x570;
        }
        else {
          pcVar11 = "ON_InsertKnot(): requested knot_value at end of NURBS domain";
          iVar3 = 0x54d;
        }
      }
      else {
        pcVar11 = "ON_InsertKnot(): requested knot_value at start of NURBS domain";
        iVar3 = 0x544;
      }
    }
    else {
      pcVar11 = "ON_InsertKnot(): requested knot_multiplicity > degree";
      iVar3 = 0x530;
    }
  }
  else {
    pcVar11 = "ON_InsertKnot(): illegal input";
    iVar3 = 0x529;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
             ,iVar3,"",pcVar11);
  return 0;
}

Assistant:

int ON_InsertKnot( 
        double knot_value, 
        int knot_multiplicity, 
        int cv_dim,   // dimension of cv's = ( = dim+1 for rational cvs )
        int order, 
        int cv_count,
        int cv_stride, 
        double* cv,   // nullptr or cv array with room for at least knot_multiplicity new cvs
        double* knot, // knot array with room for at least knot_multiplicity new knots
        int* hint     // optional hint about where to search for span to add knots to
                      // pass nullptr if no hint is available
        )
{
  int rc = 0; // return code = number of knots added

  if ( order < 2 || cv_count < order || !knot ) 
  {
    ON_ERROR("ON_InsertKnot(): illegal input" );
    return 0;
  }

  if ( cv ) 
  {
    if ( cv_dim < 1 || cv_stride < cv_dim ) 
    {
      ON_ERROR("ON_InsertKnot(): illegal input" );
      return 0;
    }
  }

  if ( knot_multiplicity >= order ) 
  {
    ON_ERROR("ON_InsertKnot(): requested knot_multiplicity > degree" );
    return 0;
  }

  // shift knot vector and cv array so that knot_value lies in first span
  int span_index = ON_NurbsSpanIndex( order, cv_count, knot, knot_value, 1, hint?*hint:0 );
  knot += span_index;
  if ( cv )
    cv += (span_index*cv_stride);
  cv_count -= span_index;

  const double knot_tolerance = ON_SpanTolerance( order, cv_count, knot, 0 );

  // check that knot_value is interior to NURBS domain
  if ( span_index == 0 ) 
  {
    if ( knot_value < knot[order-1] ) 
    {
      if ( knot_value <= knot[order-2] + knot_tolerance ) 
      {
        ON_ERROR("ON_InsertKnot(): requested knot_value at start of NURBS domain" );
        return 0;
      }
    }
  }
  if ( span_index == cv_count-order ) 
  {
    if ( knot_value > knot[order-2] && knot_value >= knot[order-1] - knot_tolerance ) 
    {
      ON_ERROR("ON_InsertKnot(): requested knot_value at end of NURBS domain" );
      return 0;
    }
  }

  // if knot_value is nearly equal to an existing knot, make it exactly equal
  if ( knot_value <= 0.5*(knot[order-2]+knot[order-1]) && fabs( knot_value - knot[order-2] ) <= knot_tolerance ) {
    knot_value = knot[order-2];
  }
  else if ( fabs( knot_value - knot[order-1] ) <= knot_tolerance ) {
    knot_value = knot[order-1];
  }

  const int degree = order-1;

  // set m = number of knots to add
  int m = 0; 
  int j;
  if ( knot_value == knot[order-2] ) {
    for ( j = order-2; m < knot_multiplicity && knot[j-m] == knot_value; m++ )
      ; // empty for
  }
  else if ( knot_value == knot[order-1] ) {
    for ( j = order-1; m < knot_multiplicity && knot[j+m] == knot_value; m++ )
      ; // empty for
  }
  m = knot_multiplicity - m;
  if ( hint )
    *hint = span_index+m;

  if ( m <= 0 )
    return 0; // no knots need to be added

  double* new_knot = (double*)onmalloc( ((2*degree+m) + (order+m)*cv_dim)*sizeof(*new_knot) );
  if ( !new_knot ) {
    ON_ERROR("ON_InsertKnot(): out of memory");
    return 0;
  }
  double* new_cv = 0;
  memcpy( new_knot, knot, 2*degree*sizeof(*new_knot) );
  if ( cv ) {
    new_cv = new_knot + (2*degree+m);
    for ( j = 0; j < order; j++ ) {
      memcpy( new_cv + j*cv_dim, cv + j*cv_stride, cv_dim*sizeof(*new_cv) );
    }
  }

  // add m more knots at knot_value
  rc = 0;
  while (m>0) {
    if ( !ON_InsertSingleKnot(cv_dim,order,cv_dim,new_cv,new_knot,knot_value) )
      break;
    m--;
    if ( new_cv )
      new_cv += cv_stride; 
    new_knot++; 
    rc++;
  }
  new_knot -= rc;
  new_cv -= rc*cv_stride;

  if ( rc > 0 ) 
  {
    // make room for rc many new knots
    int i0 = ON_KnotCount( order, cv_count ) - 1; // knot[i0] = last input knot
    int i1 = i0 + rc;
    int j_local  = (cv_count-order);
    while (j_local--)
      knot[i1--] = knot[i0--];
    
    // update knot vector
    memcpy ( knot+degree, new_knot+degree, (degree+rc)*sizeof(*new_knot) );

    if ( cv ) {
      // make room for rc many new CVs
      i0 = (cv_count-1)*cv_stride;             // cv[i0] = last coord of last input cv */
      i1 = i0 + rc*cv_stride;
      j_local = cv_count-order;
      while (j_local--) {
        memcpy( cv+i1, cv+i0, cv_dim*sizeof(*cv) );
        i1 -= cv_stride;
        i0 -= cv_stride;
      }

      // update cv values
      for ( j_local = 0; j_local < order+rc; j_local++ ) {
        memcpy( cv, new_cv, cv_dim*sizeof(*new_cv) );
        cv += cv_stride;
        new_cv += cv_dim;
      }
    }

  }

  onfree(new_knot);

  return rc;
}